

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

bool __thiscall CheckBox::update(CheckBox *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  float fVar1;
  float fVar2;
  bool bVar3;
  Vector2f *pVVar4;
  FloatRect local_38;
  
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    this_00 = &(this->super_UIComponent).super_Transformable;
    pVVar4 = sf::Transformable::getPosition(this_00);
    fVar1 = pVVar4->x;
    pVVar4 = sf::Transformable::getPosition(this_00);
    fVar2 = pVVar4->y;
    local_38 = sf::Shape::getGlobalBounds(&(this->button).super_Shape);
    bVar3 = sf::Rect<float>::contains
                      (&local_38,(float)(mouseX - (int)fVar1),(float)(mouseY - (int)fVar2));
    if (bVar3 && clicked) {
      setChecked(this,(bool)(this->_checked ^ 1));
    }
  }
  return false;
}

Assistant:

bool CheckBox::update(int mouseX, int mouseY, bool clicked) {
    if (visible) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        if (button.getGlobalBounds().contains(static_cast<float>(mouseX), static_cast<float>(mouseY)) && clicked) {
            setChecked(!_checked);
        }
    }
    return false;
}